

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *__s;
  byte bVar1;
  bool bVar2;
  PartId PVar3;
  uint uVar4;
  _Setw _Var5;
  ostream *poVar6;
  path *__rhs;
  unsigned_long uVar7;
  value_type *pvVar8;
  basic_ostream<char,_std::char_traits<char>_> *pbVar9;
  istream *this;
  uint local_7b4;
  ostream local_7b0 [4];
  uint i_1;
  ofstream output;
  uint local_5a0;
  uint cost_reduction;
  uint pass_num;
  uint cost;
  Partitionment partitionment;
  uint *cell;
  iterator __end2;
  iterator __begin2;
  Net *__range2;
  istream_iterator<unsigned_int,_char,_std::char_traits<char>,_long> local_548;
  istream_iterator<unsigned_int,_char,_std::char_traits<char>,_long> local_538;
  undefined1 local_528 [8];
  Net cur_net;
  istringstream cur_str_buf;
  uint local_38c;
  string local_388 [4];
  uint i;
  string cur_str;
  Hypergraph hypergraph;
  uint local_330;
  uint num_cells;
  uint num_nets;
  ifstream input;
  allocator<char> local_119;
  string local_118;
  uint local_f8;
  uint local_f4;
  uint n;
  uint max_diff;
  path local_c8;
  path local_90;
  undefined1 local_68 [8];
  path output_path;
  path input_path;
  char **argv_local;
  int argc_local;
  
  if ((argc == 2) || (argc == 3)) {
    std::filesystem::__cxx11::path::path<char*,std::filesystem::__cxx11::path>
              ((path *)&output_path._M_cmpts,argv + 1,auto_format);
    std::filesystem::current_path_abi_cxx11_();
    std::filesystem::__cxx11::path::filename(&local_c8,(path *)&output_path._M_cmpts);
    std::filesystem::__cxx11::path::path<char[8],std::filesystem::__cxx11::path>
              ((path *)&n,(char (*) [8])".part.2",auto_format);
    __rhs = (path *)std::filesystem::__cxx11::path::replace_extension(&local_c8);
    std::filesystem::__cxx11::operator/((path *)local_68,&local_90,__rhs);
    std::filesystem::__cxx11::path::~path((path *)&n);
    std::filesystem::__cxx11::path::~path(&local_c8);
    std::filesystem::__cxx11::path::~path(&local_90);
    local_f4 = 1;
    if (argc == 3) {
      __s = argv[2];
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,__s,&local_119);
      uVar7 = std::__cxx11::stoul(&local_118,(size_t *)0x0,10);
      uVar4 = (uint)uVar7;
      std::__cxx11::string::~string((string *)&local_118);
      std::allocator<char>::~allocator(&local_119);
      local_f8 = uVar4;
      if (uVar4 != 0) {
        local_f4 = uVar4;
      }
    }
    pvVar8 = std::filesystem::__cxx11::path::c_str((path *)&output_path._M_cmpts);
    std::ifstream::ifstream(&num_nets,pvVar8,8);
    bVar1 = std::ifstream::is_open();
    if ((bVar1 & 1) == 0) {
      poVar6 = std::operator<<((ostream *)&std::cout,"Can not open ");
      pbVar9 = std::filesystem::__cxx11::operator<<
                         ((basic_ostream<char,_std::char_traits<char>_> *)poVar6,
                          (path *)&output_path._M_cmpts);
      std::ostream::operator<<((ostream *)pbVar9,std::endl<char,std::char_traits<char>>);
      argv_local._4_4_ = 1;
      num_cells = 1;
    }
    else {
      this = (istream *)std::istream::operator>>((istream *)&num_nets,&local_330);
      std::istream::operator>>
                (this,(uint *)((long)&hypergraph.nets_.
                                      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
      Hypergraph::Hypergraph
                ((Hypergraph *)((long)&cur_str.field_2 + 8),
                 hypergraph.nets_.
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      std::__cxx11::string::string(local_388);
      std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&num_nets,local_388)
      ;
      for (local_38c = 0; local_38c < local_330; local_38c = local_38c + 1) {
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)&num_nets,local_388);
        std::__cxx11::istringstream::istringstream
                  ((istringstream *)
                   &cur_net.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,local_388,8);
        std::istream_iterator<unsigned_int,_char,_std::char_traits<char>,_long>::istream_iterator
                  (&local_538,
                   (istream_type *)
                   &cur_net.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        std::istream_iterator<unsigned_int,_char,_std::char_traits<char>,_long>::istream_iterator
                  (&local_548);
        std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)((long)&__range2 + 7));
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        vector<std::istream_iterator<unsigned_int,char,std::char_traits<char>,long>,void>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_528,&local_538,
                   &local_548,(allocator<unsigned_int> *)((long)&__range2 + 7));
        std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)((long)&__range2 + 7));
        __end2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_528);
        cell = (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                                 ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_528);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end2,(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                           *)&cell), bVar2) {
          partitionment.partitionment_.super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_end_of_storage =
               (_Bit_pointer)
               __gnu_cxx::
               __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator*(&__end2);
          *(uint *)partitionment.partitionment_.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_end_of_storage =
               (uint)*partitionment.partitionment_.super__Bvector_base<std::allocator<bool>_>.
                      _M_impl.super__Bvector_impl_data._M_end_of_storage - 1;
          __gnu_cxx::
          __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
          ::operator++(&__end2);
        }
        Hypergraph::addNet((Hypergraph *)((long)&cur_str.field_2 + 8),(Net *)local_528);
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_528);
        std::__cxx11::istringstream::~istringstream
                  ((istringstream *)
                   &cur_net.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
      }
      std::ifstream::close();
      Partitionment::Partitionment
                ((Partitionment *)&pass_num,
                 hypergraph.nets_.
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      cost_reduction =
           Partitionment::getPartitionCost
                     ((Partitionment *)&pass_num,(Hypergraph *)((long)&cur_str.field_2 + 8));
      local_5a0 = 0;
      poVar6 = std::operator<<((ostream *)&std::cout,"Initial cut cost: ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,cost_reduction);
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      while (uVar4 = FM_pass((Hypergraph *)((long)&cur_str.field_2 + 8),(Partitionment *)&pass_num,
                             local_f4), uVar4 != 0) {
        cost_reduction = cost_reduction - uVar4;
        local_5a0 = local_5a0 + 1;
        poVar6 = std::operator<<((ostream *)&std::cout,"Cut cost after pass #");
        _Var5 = std::setw(2);
        poVar6 = std::operator<<(poVar6,_Var5);
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_5a0);
        poVar6 = std::operator<<(poVar6,": ");
        _Var5 = std::setw(5);
        poVar6 = std::operator<<(poVar6,_Var5);
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,cost_reduction);
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        uVar4 = Partitionment::getPartitionCost
                          ((Partitionment *)&pass_num,(Hypergraph *)((long)&cur_str.field_2 + 8));
        if (cost_reduction != uVar4) {
          __assert_fail("cost == partitionment.getPartitionCost(hypergraph)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kachkov98[P]hypergraph-partitioning/main.cpp"
                        ,0x33,"int main(int, char **)");
        }
      }
      poVar6 = std::operator<<((ostream *)&std::cout,"Final cut cost: ");
      uVar4 = Partitionment::getPartitionCost
                        ((Partitionment *)&pass_num,(Hypergraph *)((long)&cur_str.field_2 + 8));
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,uVar4);
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      pvVar8 = std::filesystem::__cxx11::path::c_str((path *)local_68);
      std::ofstream::ofstream(local_7b0,pvVar8,0x10);
      bVar1 = std::ofstream::is_open();
      if ((bVar1 & 1) == 0) {
        poVar6 = std::operator<<((ostream *)&std::cout,"Can not open ");
        pbVar9 = std::filesystem::__cxx11::operator<<
                           ((basic_ostream<char,_std::char_traits<char>_> *)poVar6,(path *)local_68)
        ;
        std::ostream::operator<<((ostream *)pbVar9,std::endl<char,std::char_traits<char>>);
        argv_local._4_4_ = 1;
      }
      else {
        for (local_7b4 = 0;
            local_7b4 <
            hypergraph.nets_.
            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_; local_7b4 = local_7b4 + 1) {
          PVar3 = Partitionment::operator[]((Partitionment *)&pass_num,local_7b4);
          poVar6 = (ostream *)std::ostream::operator<<(local_7b0,(uint)PVar3);
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        }
        std::ofstream::close();
        argv_local._4_4_ = 0;
      }
      num_cells = 1;
      std::ofstream::~ofstream(local_7b0);
      Partitionment::~Partitionment((Partitionment *)&pass_num);
      std::__cxx11::string::~string(local_388);
      Hypergraph::~Hypergraph((Hypergraph *)((long)&cur_str.field_2 + 8));
    }
    std::ifstream::~ifstream(&num_nets);
    std::filesystem::__cxx11::path::~path((path *)local_68);
    std::filesystem::__cxx11::path::~path((path *)&output_path._M_cmpts);
  }
  else {
    poVar6 = std::operator<<((ostream *)&std::cout,
                             "Usage: ./partioner [path to *.hgr file] [optional max difference]");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    argv_local._4_4_ = 1;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char *argv[]) {
  if (argc != 2 && argc != 3) {
    std::cout << "Usage: ./partioner [path to *.hgr file] [optional max difference]" << std::endl;
    return 1;
  }
  std::filesystem::path input_path = argv[1],
                        output_path = std::filesystem::current_path() /
                                      input_path.filename().replace_extension(".part.2");
  unsigned max_diff = 1;
  if (argc == 3)
    if (unsigned n = std::stoul(argv[2]))
      max_diff = n;
  // Load hypergraph
  std::ifstream input(input_path.c_str());
  if (!input.is_open()) {
    std::cout << "Can not open " << input_path << std::endl;
    return 1;
  }
  unsigned num_nets, num_cells;
  input >> num_nets >> num_cells;
  Hypergraph hypergraph(num_cells);
  std::string cur_str;
  std::getline(input, cur_str);
  for (unsigned i = 0; i < num_nets; ++i) {
    std::getline(input, cur_str);
    std::istringstream cur_str_buf(cur_str);
    Net cur_net{std::istream_iterator<unsigned>(cur_str_buf), std::istream_iterator<unsigned>()};
    for (unsigned &cell : cur_net)
      --cell;
    hypergraph.addNet(cur_net);
  }
  input.close();
  // Do partioning
  Partitionment partitionment(num_cells);
  unsigned cost = partitionment.getPartitionCost(hypergraph), pass_num = 0;
  std::cout << "Initial cut cost: " << cost << std::endl;
  while (auto cost_reduction = FM_pass(hypergraph, partitionment, max_diff)) {
    cost -= cost_reduction;
    ++pass_num;
    std::cout << "Cut cost after pass #" << std::setw(2) << pass_num << ": " << std::setw(5) << cost
              << std::endl;
    assert(cost == partitionment.getPartitionCost(hypergraph));
  }
  std::cout << "Final cut cost: " << partitionment.getPartitionCost(hypergraph) << std::endl;
  // Save results
  std::ofstream output(output_path.c_str());
  if (!output.is_open()) {
    std::cout << "Can not open " << output_path << std::endl;
    return 1;
  }
  for (unsigned i = 0; i < num_cells; ++i)
    output << +partitionment[i] << std::endl;
  output.close();
  return 0;
}